

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_encoder.cc
# Opt level: O0

bool __thiscall
draco::MetadataEncoder::EncodeGeometryMetadata
          (MetadataEncoder *this,EncoderBuffer *out_buffer,GeometryMetadata *metadata)

{
  bool bVar1;
  MetadataEncoder *this_00;
  GeometryMetadata *in_RDX;
  AttributeMetadata *in_RSI;
  EncoderBuffer *in_RDI;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *att_metadata
  ;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *__range1;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *att_metadatas;
  AttributeMetadata *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
  local_38;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *local_30;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *local_28;
  AttributeMetadata *local_18;
  bool local_1;
  
  if (in_RDX == (GeometryMetadata *)0x0) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    local_28 = GeometryMetadata::attribute_metadatas(in_RDX);
    std::
    vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
    ::size(local_28);
    EncodeVarint<unsigned_int>((uint)in_RDI,(EncoderBuffer *)in_stack_ffffffffffffffa8);
    local_30 = local_28;
    local_38._M_current =
         (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *)
         std::
         vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
         ::begin((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                  *)in_stack_ffffffffffffffa8);
    std::
    vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
    ::end((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           *)in_stack_ffffffffffffffa8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      this_00 = (MetadataEncoder *)
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                ::operator*(&local_38);
      in_stack_ffffffffffffffa8 = local_18;
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::get
                ((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)in_RDI);
      EncodeAttributeMetadata(this_00,in_RDI,in_stack_ffffffffffffffa8);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
      ::operator++(&local_38);
    }
    EncodeMetadata((MetadataEncoder *)__range1,(EncoderBuffer *)__begin1._M_current,
                   (Metadata *)__end1._M_current);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MetadataEncoder::EncodeGeometryMetadata(EncoderBuffer *out_buffer,
                                             const GeometryMetadata *metadata) {
  if (!metadata) {
    return false;
  }
  // Encode number of attribute metadata.
  const std::vector<std::unique_ptr<AttributeMetadata>> &att_metadatas =
      metadata->attribute_metadatas();
  // TODO(draco-eng): Limit the number of attributes.
  EncodeVarint(static_cast<uint32_t>(att_metadatas.size()), out_buffer);
  // Encode each attribute metadata
  for (auto &&att_metadata : att_metadatas) {
    EncodeAttributeMetadata(out_buffer, att_metadata.get());
  }
  // Encode normal metadata part.
  EncodeMetadata(out_buffer, static_cast<const Metadata *>(metadata));

  return true;
}